

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

RPCHelpMan * testmempoolaccept(void)

{
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_13;
  string description_14;
  string description_15;
  RPCMethodImpl fun;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_12;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  undefined4 in_stack_ffffffffffffe9d8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe9dc;
  RPCArgOptions *pRVar10;
  undefined4 uVar11;
  undefined8 in_stack_ffffffffffffe9e0;
  undefined8 in_stack_ffffffffffffe9e8;
  undefined8 in_stack_ffffffffffffe9f0;
  _Manager_type in_stack_ffffffffffffe9f8;
  undefined8 in_stack_ffffffffffffea00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffea08;
  pointer in_stack_ffffffffffffea18;
  pointer pRVar12;
  pointer in_stack_ffffffffffffea20;
  pointer pRVar13;
  pointer in_stack_ffffffffffffea28;
  pointer pRVar14;
  undefined8 in_stack_ffffffffffffea30;
  pointer in_stack_ffffffffffffea38;
  pointer pRVar15;
  pointer in_stack_ffffffffffffea40;
  pointer pRVar16;
  pointer in_stack_ffffffffffffea48;
  pointer pRVar17;
  undefined8 in_stack_ffffffffffffea50;
  pointer in_stack_ffffffffffffea58;
  pointer in_stack_ffffffffffffea60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffea68;
  pointer in_stack_ffffffffffffea78;
  pointer pRVar18;
  pointer in_stack_ffffffffffffea80;
  pointer pRVar19;
  pointer in_stack_ffffffffffffea88;
  undefined8 in_stack_ffffffffffffea90;
  pointer in_stack_ffffffffffffea98;
  pointer in_stack_ffffffffffffeaa0;
  pointer in_stack_ffffffffffffeaa8;
  undefined1 in_stack_ffffffffffffeab0 [16];
  undefined1 in_stack_ffffffffffffeac0 [24];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1528;
  allocator<char> local_150a;
  allocator<char> local_1509;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1508;
  allocator<char> local_14ea;
  allocator<char> local_14e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14e8;
  allocator<char> local_14ca;
  allocator<char> local_14c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14c8;
  allocator<char> local_14aa;
  allocator<char> local_14a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14a8;
  allocator<char> local_148a;
  allocator<char> local_1489;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1488;
  allocator<char> local_146a;
  allocator<char> local_1469;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1468;
  allocator<char> local_144a;
  allocator<char> local_1449;
  RPCResults local_1448;
  allocator_type local_142d;
  allocator<char> local_142c;
  allocator_type local_142b;
  allocator<char> local_142a;
  allocator<char> local_1429;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1428;
  allocator<char> local_140a;
  allocator<char> local_1409;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1408;
  allocator<char> local_13e9;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  string local_1388;
  string local_1368;
  string local_1348;
  string local_1328;
  string local_1308;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  string local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8;
  char *local_1188;
  size_type local_1180;
  char local_1178 [8];
  undefined8 uStack_1170;
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  RPCResult local_10e8;
  string local_1060 [32];
  string local_1040 [16];
  undefined8 local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1000;
  string local_fe0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  string local_fa0 [32];
  RPCResult local_f80 [3];
  string local_de8 [32];
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  RPCResult local_c68 [4];
  RPCResult local_a48;
  RPCResult local_9c0;
  RPCResult local_938;
  string local_8b0 [32];
  string local_890 [32];
  RPCResult local_870;
  string local_7e8 [32];
  string local_7c8 [32];
  RPCResult local_7a8;
  RPCArgOptions local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  string local_698;
  UniValue local_678;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_620;
  string local_5c0 [32];
  RPCArgOptions local_5a0;
  RPCArgOptions local_558;
  string local_510 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f0;
  undefined1 local_498;
  string local_490 [32];
  RPCArg local_470;
  string local_368 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_348;
  undefined1 local_2f0;
  string local_2e8 [32];
  RPCArg local_2c8 [2];
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"testmempoolaccept",&local_13e9);
  util::ToString<unsigned_int>(&local_b8,&MAX_PACKAGE_COUNT);
  std::operator+(&local_98,
                 "\nReturns result of mempool acceptance tests indicating if raw transaction(s) (serialized, hex-encoded) would be accepted by mempool.\n\nIf multiple transactions are passed in, parents must come before children and package policies apply: the transactions cannot conflict with any mempool transactions or each other.\n\nIf one transaction fails, other transactions may not be fully validated (the \'allowed\' key will be blank).\n\nThe maximum number of transactions allowed is "
                 ,&local_b8);
  std::operator+(&local_78,&local_98,
                 ".\n\nThis checks if transactions violate the consensus or policy rules.\n\nSee sendrawtransaction call.\n"
                );
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"rawtxs",&local_1409);
  local_348._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"An array of hex strings of raw transactions.",&local_140a);
  std::__cxx11::string::string<std::allocator<char>>(local_490,"rawtx",&local_1429);
  local_4f0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_498 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_510,"",&local_142a);
  local_558.oneline_description._M_dataplus._M_p = (pointer)&local_558.oneline_description.field_2;
  local_558.skip_type_check = false;
  local_558.oneline_description._M_string_length = 0;
  local_558.oneline_description.field_2._M_local_buf[0] = '\0';
  local_558.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_558.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_558.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_558._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe9dc;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe9d8;
  name._M_string_length = in_stack_ffffffffffffe9e0;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  name.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea00;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe9f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea08;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea20;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea28;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffea50;
  description_13._M_string_length = (size_type)in_stack_ffffffffffffea60;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea58;
  description_13.field_2 = in_stack_ffffffffffffea68;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea80;
  opts._0_8_ = in_stack_ffffffffffffea78;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffea88;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffea90;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffea98;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeaa0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeaa8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeab0._0_8_;
  opts.hidden = (bool)in_stack_ffffffffffffeab0[8];
  opts.also_positional = (bool)in_stack_ffffffffffffeab0[9];
  opts._66_6_ = in_stack_ffffffffffffeab0._10_6_;
  RPCArg::RPCArg(&local_470,name,(Type)local_490,fallback,description_13,opts);
  __l._M_len = 1;
  __l._M_array = &local_470;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1428,__l,&local_142b);
  local_5a0.oneline_description._M_dataplus._M_p = (pointer)&local_5a0.oneline_description.field_2;
  local_5a0.skip_type_check = false;
  local_5a0.oneline_description._M_string_length = 0;
  local_5a0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_5a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_5a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_5a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_5a0._58_8_ = 0;
  pRVar10 = &local_5a0;
  name_00._M_string_length = in_stack_ffffffffffffe9e0;
  name_00._M_dataplus._M_p = &pRVar10->skip_type_check;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  name_00.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea00;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe9f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea08;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea18;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea20;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea28;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea30;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea38;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea40;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea48;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffea50;
  description_14._M_string_length = (size_type)in_stack_ffffffffffffea60;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea58;
  description_14.field_2 = in_stack_ffffffffffffea68;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffea80;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffea78;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffea88;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea98;
  opts_01._0_8_ = in_stack_ffffffffffffea90;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeaa0;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeaa8;
  opts_01._32_16_ = in_stack_ffffffffffffeab0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeac0._0_8_;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeac0._8_8_;
  opts_01.hidden = (bool)in_stack_ffffffffffffeac0[0x10];
  opts_01.also_positional = (bool)in_stack_ffffffffffffeac0[0x11];
  opts_01._66_6_ = in_stack_ffffffffffffeac0._18_6_;
  RPCArg::RPCArg(local_2c8,name_00,(Type)local_2e8,fallback_00,description_14,inner_12,opts_01);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"maxfeerate",&local_142c);
  FormatMoney_abi_cxx11_(&local_698,node::DEFAULT_MAX_RAW_TX_FEE_RATE);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_678,&local_698);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_620,&local_678);
  std::operator+(&local_6d8,
                 "Reject transactions whose fee rate is higher than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_6b8,&local_6d8,
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."
                );
  local_720.oneline_description._M_dataplus._M_p = (pointer)&local_720.oneline_description.field_2;
  local_720.skip_type_check = false;
  local_720.oneline_description._M_string_length = 0;
  local_720.oneline_description.field_2._M_local_buf[0] = '\0';
  local_720.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_720.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_720.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_720.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_720._58_8_ = 0;
  name_01._M_string_length = in_stack_ffffffffffffe9e0;
  name_01._M_dataplus._M_p = &pRVar10->skip_type_check;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  name_01.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea00;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe9f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea08;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea18;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea20;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea28;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea30;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea38;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea40;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea48;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffea50;
  description_15._M_string_length = (size_type)in_stack_ffffffffffffea60;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea58;
  description_15.field_2 = in_stack_ffffffffffffea68;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea80;
  opts_00._0_8_ = in_stack_ffffffffffffea78;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffea88;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffea90;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffea98;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeaa0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeaa8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeab0._0_8_;
  opts_00.hidden = (bool)in_stack_ffffffffffffeab0[8];
  opts_00.also_positional = (bool)in_stack_ffffffffffffeab0[9];
  opts_00._66_6_ = in_stack_ffffffffffffeab0._10_6_;
  RPCArg::RPCArg(local_2c8 + 1,name_01,(Type)local_5c0,fallback_01,description_15,opts_00);
  __l_00._M_len = 2;
  __l_00._M_array = local_2c8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1408,__l_00,&local_142d);
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"",&local_1449);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7e8,
             "The result of the mempool acceptance test for each raw transaction in the input array.\nReturns results for each transaction in the same order they were passed in.\nTransactions that cannot be fully validated due to failures in other transactions will not contain an \'allowed\' result.\n"
             ,&local_144a);
  std::__cxx11::string::string<std::allocator<char>>(local_890,"",&local_1469);
  std::__cxx11::string::string<std::allocator<char>>(local_8b0,"",&local_146a);
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"txid",&local_1489);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ca8,"The transaction hash in hex",&local_148a);
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_ffffffffffffe9e0;
  m_key_name._M_dataplus._M_p = &pRVar10->skip_type_check;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  description._M_string_length = in_stack_ffffffffffffea00;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description.field_2 = in_stack_ffffffffffffea08;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffea20;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffea18;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult(local_c68,STR_HEX,m_key_name,description,inner,SUB81(local_c88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_cc8,"wtxid",&local_14a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ce8,"The transaction witness hash in hex",&local_14aa);
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe9e0;
  m_key_name_00._M_dataplus._M_p = &pRVar10->skip_type_check;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  description_00._M_string_length = in_stack_ffffffffffffea00;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_00.field_2 = in_stack_ffffffffffffea08;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (local_c68 + 1,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(local_cc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_d08,"package-error",&local_14c9);
  uVar11 = (undefined4)((ulong)pRVar10 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d28,
             "Package validation error, if any (only possible if rawtxs had more than 1 transaction)."
             ,&local_14ca);
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_ffffffffffffe9e0;
  auVar1._0_4_ = uVar11;
  auVar1._12_8_ = in_stack_ffffffffffffe9e8;
  auVar1._20_8_ = in_stack_ffffffffffffe9f0;
  auVar1._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffea00;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_01.field_2 = in_stack_ffffffffffffea08;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (local_c68 + 2,STR,(string)(auVar1 << 0x20),SUB81(local_d08,0),description_01,inner_01,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_d48,"allowed",&local_14e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d68,
             "Whether this tx would be accepted to the mempool and pass client-specified maxfeerate. If not present, the tx was not fully validated due to a failure in another tx in the list."
             ,&local_14ea);
  local_1508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_8_ = in_stack_ffffffffffffe9e0;
  auVar2._0_4_ = uVar11;
  auVar2._12_8_ = in_stack_ffffffffffffe9e8;
  auVar2._20_8_ = in_stack_ffffffffffffe9f0;
  auVar2._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffea00;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_02.field_2 = in_stack_ffffffffffffea08;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (local_c68 + 3,BOOL,(string)(auVar2 << 0x20),SUB81(local_d48,0),description_02,inner_02,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_d88,"vsize",&local_1509);
  std::__cxx11::string::string<std::allocator<char>>
            (local_da8,
             "Virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted (only present when \'allowed\' is true)"
             ,&local_150a);
  local_1528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar3._4_8_ = in_stack_ffffffffffffe9e0;
  auVar3._0_4_ = uVar11;
  auVar3._12_8_ = in_stack_ffffffffffffe9e8;
  auVar3._20_8_ = in_stack_ffffffffffffe9f0;
  auVar3._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffea00;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_03.field_2 = in_stack_ffffffffffffea08;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (&local_a48,NUM,(string)(auVar3 << 0x20),SUB81(local_d88,0),description_03,inner_03,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_dc8,"fees",(allocator<char> *)&stack0xffffffffffffead7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_de8,"Transaction fees (only present if \'allowed\' is true)",
             (allocator<char> *)&stack0xffffffffffffead6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fa0,"base",(allocator<char> *)&stack0xffffffffffffeab7);
  std::operator+(&local_fc0,"transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe9e0;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  description_04._M_string_length = in_stack_ffffffffffffea00;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_04.field_2 = in_stack_ffffffffffffea08;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (local_f80,STR_AMOUNT,m_key_name_01,description_04,inner_04,SUB81(local_fa0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_fe0,"effective-feerate",(allocator<char> *)&stack0xffffffffffffea97);
  std::operator+(&local_1020,"the effective feerate in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_1000,&local_1020,
                 " per KvB. May differ from the base feerate if, for example, there are modified fees from prioritisetransaction or a package feerate was used."
                );
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  uVar9 = 0;
  auVar4._4_8_ = in_stack_ffffffffffffe9e0;
  auVar4._0_4_ = uVar11;
  auVar4._12_8_ = in_stack_ffffffffffffe9e8;
  auVar4._20_8_ = in_stack_ffffffffffffe9f0;
  auVar4._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffea00;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_05.field_2 = in_stack_ffffffffffffea08;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (local_f80 + 1,STR_AMOUNT,(string)(auVar4 << 0x20),SUB81(local_fe0,0),description_05,
             inner_05,false);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1040,"effective-includes",(allocator<char> *)&stack0xffffffffffffea77);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1060,"transactions whose fees and vsizes are included in effective-feerate.",
             (allocator<char> *)&stack0xffffffffffffea76);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1108,"",(allocator<char> *)&stack0xffffffffffffea57);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1128,"transaction wtxid in hex",(allocator<char> *)&stack0xffffffffffffea56);
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe9e0;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  description_06._M_string_length = in_stack_ffffffffffffea00;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_06.field_2 = in_stack_ffffffffffffea08;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (&local_10e8,STR_HEX,m_key_name_02,description_06,inner_06,SUB81(local_1108,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_10e8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea58,__l_01,
             (allocator_type *)&stack0xffffffffffffea37);
  auVar5._4_8_ = in_stack_ffffffffffffe9e0;
  auVar5._0_4_ = uVar11;
  auVar5._12_8_ = in_stack_ffffffffffffe9e8;
  auVar5._20_8_ = in_stack_ffffffffffffe9f0;
  auVar5._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffea00;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_07.field_2 = in_stack_ffffffffffffea08;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (local_f80 + 2,ARR,(string)(auVar5 << 0x20),SUB81(local_1040,0),description_07,inner_07,
             false);
  __l_02._M_len = 3;
  __l_02._M_array = local_f80;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeab8,__l_02,
             (allocator_type *)&stack0xffffffffffffea36);
  auVar6._4_8_ = in_stack_ffffffffffffe9e0;
  auVar6._0_4_ = uVar11;
  auVar6._12_8_ = in_stack_ffffffffffffe9e8;
  auVar6._20_8_ = in_stack_ffffffffffffe9f0;
  auVar6._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffea00;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_08.field_2 = in_stack_ffffffffffffea08;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea20;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea18;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea28;
  RPCResult::RPCResult
            (&local_9c0,OBJ,(string)(auVar6 << 0x20),SUB81(local_dc8,0),description_08,inner_08,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_1148,"reject-reason",(allocator<char> *)&stack0xffffffffffffea35);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1168,"Rejection string (only present when \'allowed\' is false)",
             (allocator<char> *)&stack0xffffffffffffea34);
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  uVar9 = 0;
  auVar7._4_8_ = in_stack_ffffffffffffe9e0;
  auVar7._0_4_ = uVar11;
  auVar7._12_8_ = in_stack_ffffffffffffe9e8;
  auVar7._20_8_ = in_stack_ffffffffffffe9f0;
  auVar7._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffea00;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_09.field_2._M_local_buf = in_stack_ffffffffffffea08._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_938,STR,(string)(auVar7 << 0x20),SUB81(local_1148,0),description_09,inner_09,
             true);
  __l_03._M_len = 7;
  __l_03._M_array = local_c68;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1488,__l_03,(allocator_type *)&stack0xffffffffffffea17);
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe9e0;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  description_10._M_string_length = in_stack_ffffffffffffea00;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_10.field_2._M_local_buf = in_stack_ffffffffffffea08._M_local_buf;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar13;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar12;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar14;
  RPCResult::RPCResult(&local_870,OBJ,m_key_name_03,description_10,inner_10,SUB81(local_890,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_870;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1468,__l_04,(allocator_type *)&stack0xffffffffffffea16);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe9e0;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe9e8;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe9f0;
  description_11._M_string_length = in_stack_ffffffffffffea00;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9f8;
  description_11.field_2 = in_stack_ffffffffffffea08;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar13;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar12;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar14;
  RPCResult::RPCResult(&local_7a8,ARR,m_key_name_04,description_11,inner_11,SUB81(local_7c8,0));
  result._4_4_ = uVar11;
  result.m_type = uVar9;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9e0;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe9e8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe9f0;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe9f8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea00;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffea08;
  result._64_8_ = pRVar12;
  result.m_description._M_dataplus._M_p = (pointer)pRVar13;
  result.m_description._M_string_length = (size_type)pRVar14;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffea30;
  result.m_description.field_2._8_8_ = pRVar15;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar16;
  result.m_cond._M_string_length = (size_type)pRVar17;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffea50;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffea58;
  RPCResults::RPCResults(&local_1448,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12a8,"createrawtransaction",
             (allocator<char> *)&stack0xffffffffffffea15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12c8,
             "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"",
             (allocator<char> *)&stack0xffffffffffffea14);
  HelpExampleCli(&local_1288,&local_12a8,&local_12c8);
  std::operator+(&local_1268,"\nCreate a transaction\n",&local_1288);
  std::operator+(&local_1248,&local_1268,"Sign the transaction, and get back the hex\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1308,"signrawtransactionwithwallet",
             (allocator<char> *)&stack0xffffffffffffea13);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1328,"\"myhex\"",(allocator<char> *)&stack0xffffffffffffea12);
  HelpExampleCli(&local_12e8,&local_1308,&local_1328);
  std::operator+(&local_1228,&local_1248,&local_12e8);
  std::operator+(&local_1208,&local_1228,"\nTest acceptance of the transaction (signed hex)\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1368,"testmempoolaccept",(allocator<char> *)&stack0xffffffffffffea11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1388,"\'[\"signedhex\"]\'",(allocator<char> *)&stack0xffffffffffffea10
            );
  HelpExampleCli(&local_1348,&local_1368,&local_1388);
  std::operator+(&local_11e8,&local_1208,&local_1348);
  std::operator+(&local_11c8,&local_11e8,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13c8,"testmempoolaccept",(allocator<char> *)&stack0xffffffffffffea0f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13e8,"[\"signedhex\"]",(allocator<char> *)&stack0xffffffffffffea0e);
  HelpExampleRpc(&local_13a8,&local_13c8,&local_13e8);
  std::operator+(&local_11a8,&local_11c8,&local_13a8);
  local_1188 = local_1178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11a8._M_dataplus._M_p == &local_11a8.field_2) {
    uStack_1170 = local_11a8.field_2._8_8_;
  }
  else {
    local_1188 = local_11a8._M_dataplus._M_p;
  }
  local_1180 = local_11a8._M_string_length;
  local_11a8._M_string_length = 0;
  local_11a8.field_2._M_local_buf[0] = '\0';
  description_12._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:160:9)>
       ::_M_invoke;
  description_12._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:160:9)>
                ::_M_manager;
  description_12.field_2 = in_stack_ffffffffffffea08;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar13;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar15;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea30;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar16;
  examples.m_examples._M_string_length = in_stack_ffffffffffffea50;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar17;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea58;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffea60;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar18;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_ffffffffffffea68._M_local_buf;
  fun._M_invoker = (_Invoker_type)pRVar19;
  local_11a8._M_dataplus._M_p = (pointer)&local_11a8.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffe9e0,&stack0xffffffffffffe9e8)),
             description_12,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe9e8);
  std::__cxx11::string::~string((string *)&local_1188);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string((string *)&local_13a8);
  std::__cxx11::string::~string((string *)&local_13e8);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::__cxx11::string::~string((string *)&local_11e8);
  std::__cxx11::string::~string((string *)&local_1348);
  std::__cxx11::string::~string((string *)&local_1388);
  std::__cxx11::string::~string((string *)&local_1368);
  std::__cxx11::string::~string((string *)&local_1208);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::~string((string *)&local_1328);
  std::__cxx11::string::~string((string *)&local_1308);
  std::__cxx11::string::~string((string *)&local_1248);
  std::__cxx11::string::~string((string *)&local_1268);
  std::__cxx11::string::~string((string *)&local_1288);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::__cxx11::string::~string((string *)&local_12a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1448.m_results);
  RPCResult::~RPCResult(&local_7a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1468);
  RPCResult::~RPCResult(&local_870);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1488);
  lVar8 = 0x330;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_c68[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea18);
  std::__cxx11::string::~string(local_1168);
  std::__cxx11::string::~string(local_1148);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeab8);
  lVar8 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_f80[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea58);
  RPCResult::~RPCResult(&local_10e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea38);
  std::__cxx11::string::~string(local_1128);
  std::__cxx11::string::~string(local_1108);
  std::__cxx11::string::~string(local_1060);
  std::__cxx11::string::~string(local_1040);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea78);
  std::__cxx11::string::~string((string *)&local_1000);
  std::__cxx11::string::~string((string *)&local_1020);
  std::__cxx11::string::~string(local_fe0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea98);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::__cxx11::string::~string(local_fa0);
  std::__cxx11::string::~string(local_de8);
  std::__cxx11::string::~string(local_dc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1528);
  std::__cxx11::string::~string(local_da8);
  std::__cxx11::string::~string(local_d88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1508);
  std::__cxx11::string::~string(local_d68);
  std::__cxx11::string::~string(local_d48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14e8);
  std::__cxx11::string::~string(local_d28);
  std::__cxx11::string::~string(local_d08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14c8);
  std::__cxx11::string::~string(local_ce8);
  std::__cxx11::string::~string(local_cc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14a8);
  std::__cxx11::string::~string(local_ca8);
  std::__cxx11::string::~string(local_c88);
  std::__cxx11::string::~string(local_8b0);
  std::__cxx11::string::~string(local_890);
  std::__cxx11::string::~string(local_7e8);
  std::__cxx11::string::~string(local_7c8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1408);
  lVar8 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_2c8[0].m_names._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_720);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_620);
  UniValue::~UniValue(&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string(local_5c0);
  RPCArgOptions::~RPCArgOptions(&local_5a0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1428);
  RPCArg::~RPCArg(&local_470);
  RPCArgOptions::~RPCArgOptions(&local_558);
  std::__cxx11::string::~string(local_510);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f0._M_first);
  std::__cxx11::string::~string(local_490);
  std::__cxx11::string::~string(local_368);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_348._M_first);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan testmempoolaccept()
{
    return RPCHelpMan{"testmempoolaccept",
        "\nReturns result of mempool acceptance tests indicating if raw transaction(s) (serialized, hex-encoded) would be accepted by mempool.\n"
        "\nIf multiple transactions are passed in, parents must come before children and package policies apply: the transactions cannot conflict with any mempool transactions or each other.\n"
        "\nIf one transaction fails, other transactions may not be fully validated (the 'allowed' key will be blank).\n"
        "\nThe maximum number of transactions allowed is " + ToString(MAX_PACKAGE_COUNT) + ".\n"
        "\nThis checks if transactions violate the consensus or policy rules.\n"
        "\nSee sendrawtransaction call.\n",
        {
            {"rawtxs", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of hex strings of raw transactions.",
                {
                    {"rawtx", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
        },
        RPCResult{
            RPCResult::Type::ARR, "", "The result of the mempool acceptance test for each raw transaction in the input array.\n"
                                      "Returns results for each transaction in the same order they were passed in.\n"
                                      "Transactions that cannot be fully validated due to failures in other transactions will not contain an 'allowed' result.\n",
            {
                {RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::STR_HEX, "txid", "The transaction hash in hex"},
                    {RPCResult::Type::STR_HEX, "wtxid", "The transaction witness hash in hex"},
                    {RPCResult::Type::STR, "package-error", /*optional=*/true, "Package validation error, if any (only possible if rawtxs had more than 1 transaction)."},
                    {RPCResult::Type::BOOL, "allowed", /*optional=*/true, "Whether this tx would be accepted to the mempool and pass client-specified maxfeerate. "
                                                       "If not present, the tx was not fully validated due to a failure in another tx in the list."},
                    {RPCResult::Type::NUM, "vsize", /*optional=*/true, "Virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted (only present when 'allowed' is true)"},
                    {RPCResult::Type::OBJ, "fees", /*optional=*/true, "Transaction fees (only present if 'allowed' is true)",
                    {
                        {RPCResult::Type::STR_AMOUNT, "base", "transaction fee in " + CURRENCY_UNIT},
                        {RPCResult::Type::STR_AMOUNT, "effective-feerate", /*optional=*/false, "the effective feerate in " + CURRENCY_UNIT + " per KvB. May differ from the base feerate if, for example, there are modified fees from prioritisetransaction or a package feerate was used."},
                        {RPCResult::Type::ARR, "effective-includes", /*optional=*/false, "transactions whose fees and vsizes are included in effective-feerate.",
                            {RPCResult{RPCResult::Type::STR_HEX, "", "transaction wtxid in hex"},
                        }},
                    }},
                    {RPCResult::Type::STR, "reject-reason", /*optional=*/true, "Rejection string (only present when 'allowed' is false)"},
                }},
            }
        },
        RPCExamples{
            "\nCreate a transaction\n"
            + HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"") +
            "Sign the transaction, and get back the hex\n"
            + HelpExampleCli("signrawtransactionwithwallet", "\"myhex\"") +
            "\nTest acceptance of the transaction (signed hex)\n"
            + HelpExampleCli("testmempoolaccept", R"('["signedhex"]')") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("testmempoolaccept", "[\"signedhex\"]")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const UniValue raw_transactions = request.params[0].get_array();
            if (raw_transactions.size() < 1 || raw_transactions.size() > MAX_PACKAGE_COUNT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER,
                                   "Array must contain between 1 and " + ToString(MAX_PACKAGE_COUNT) + " transactions.");
            }

            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};

            std::vector<CTransactionRef> txns;
            txns.reserve(raw_transactions.size());
            for (const auto& rawtx : raw_transactions.getValues()) {
                CMutableTransaction mtx;
                if (!DecodeHexTx(mtx, rawtx.get_str())) {
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR,
                                       "TX decode failed: " + rawtx.get_str() + " Make sure the tx has at least one input.");
                }
                txns.emplace_back(MakeTransactionRef(std::move(mtx)));
            }

            NodeContext& node = EnsureAnyNodeContext(request.context);
            CTxMemPool& mempool = EnsureMemPool(node);
            ChainstateManager& chainman = EnsureChainman(node);
            Chainstate& chainstate = chainman.ActiveChainstate();
            const PackageMempoolAcceptResult package_result = [&] {
                LOCK(::cs_main);
                if (txns.size() > 1) return ProcessNewPackage(chainstate, mempool, txns, /*test_accept=*/true, /*client_maxfeerate=*/{});
                return PackageMempoolAcceptResult(txns[0]->GetWitnessHash(),
                                                  chainman.ProcessTransaction(txns[0], /*test_accept=*/true));
            }();

            UniValue rpc_result(UniValue::VARR);
            // We will check transaction fees while we iterate through txns in order. If any transaction fee
            // exceeds maxfeerate, we will leave the rest of the validation results blank, because it
            // doesn't make sense to return a validation result for a transaction if its ancestor(s) would
            // not be submitted.
            bool exit_early{false};
            for (const auto& tx : txns) {
                UniValue result_inner(UniValue::VOBJ);
                result_inner.pushKV("txid", tx->GetHash().GetHex());
                result_inner.pushKV("wtxid", tx->GetWitnessHash().GetHex());
                if (package_result.m_state.GetResult() == PackageValidationResult::PCKG_POLICY) {
                    result_inner.pushKV("package-error", package_result.m_state.ToString());
                }
                auto it = package_result.m_tx_results.find(tx->GetWitnessHash());
                if (exit_early || it == package_result.m_tx_results.end()) {
                    // Validation unfinished. Just return the txid and wtxid.
                    rpc_result.push_back(std::move(result_inner));
                    continue;
                }
                const auto& tx_result = it->second;
                // Package testmempoolaccept doesn't allow transactions to already be in the mempool.
                CHECK_NONFATAL(tx_result.m_result_type != MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
                if (tx_result.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    const CAmount fee = tx_result.m_base_fees.value();
                    // Check that fee does not exceed maximum fee
                    const int64_t virtual_size = tx_result.m_vsize.value();
                    const CAmount max_raw_tx_fee = max_raw_tx_fee_rate.GetFee(virtual_size);
                    if (max_raw_tx_fee && fee > max_raw_tx_fee) {
                        result_inner.pushKV("allowed", false);
                        result_inner.pushKV("reject-reason", "max-fee-exceeded");
                        exit_early = true;
                    } else {
                        // Only return the fee and vsize if the transaction would pass ATMP.
                        // These can be used to calculate the feerate.
                        result_inner.pushKV("allowed", true);
                        result_inner.pushKV("vsize", virtual_size);
                        UniValue fees(UniValue::VOBJ);
                        fees.pushKV("base", ValueFromAmount(fee));
                        fees.pushKV("effective-feerate", ValueFromAmount(tx_result.m_effective_feerate.value().GetFeePerK()));
                        UniValue effective_includes_res(UniValue::VARR);
                        for (const auto& wtxid : tx_result.m_wtxids_fee_calculations.value()) {
                            effective_includes_res.push_back(wtxid.ToString());
                        }
                        fees.pushKV("effective-includes", std::move(effective_includes_res));
                        result_inner.pushKV("fees", std::move(fees));
                    }
                } else {
                    result_inner.pushKV("allowed", false);
                    const TxValidationState state = tx_result.m_state;
                    if (state.GetResult() == TxValidationResult::TX_MISSING_INPUTS) {
                        result_inner.pushKV("reject-reason", "missing-inputs");
                    } else {
                        result_inner.pushKV("reject-reason", state.GetRejectReason());
                    }
                }
                rpc_result.push_back(std::move(result_inner));
            }
            return rpc_result;
        },
    };
}